

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

void syms_add(sym_t *s)

{
  sym_t **ppsVar1;
  sym_t *in_RDI;
  int i;
  size_t in_stack_ffffffffffffffe8;
  void *in_stack_fffffffffffffff0;
  
  if (in_RDI->id[0] == '\0') {
    free(in_RDI);
  }
  else {
    if (in_RDI->type_id == 0) {
      in_RDI->type_id = 0x80;
    }
    scope->num_syms = scope->num_syms + 1;
    ppsVar1 = (sym_t **)mrealloc(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    scope->syms = ppsVar1;
    scope->syms[scope->num_syms - 1] = in_RDI;
  }
  return;
}

Assistant:

void syms_add(sym_t* s)
{
    int i;
    /* empty declaration like 'static byte;' */
    if (s->id[0] == 0)
    {
        free(s);
        return;
    }

    /* set default type */
    if (!s->type_id)
        s->type_id = BYTE;

    /* check for redefinition
    for (i = 0; i < scope->num_syms; ++i)
    {
        if (strcmp(s->id, scope->syms[i]->id) == 0)
        {
            err(E, "redefinition of '%s'", s->id);
            return;
        }
    }
    */

    scope->num_syms++;
    scope->syms = (sym_t**)mrealloc(scope->syms,
                                   sizeof(sym_t*) * scope->num_syms);
    scope->syms[scope->num_syms - 1] = s;


}